

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skl_motion.cxx
# Opt level: O2

void __thiscall xray_re::xr_bone_motion::load_1(xr_bone_motion *this,xr_reader *r)

{
  uint8_t *puVar1;
  uint_fast32_t i;
  long lVar2;
  
  xr_reader::r_sz(r,&this->m_name);
  puVar1 = (r->field_2).m_p;
  (r->field_2).m_p = puVar1 + 4;
  this->m_flags = *puVar1;
  create_envelopes(this);
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    xr_envelope::load_1(this->m_envelopes[lVar2],r);
  }
  return;
}

Assistant:

void xr_bone_motion::load_1(xr_reader& r)
{
	r.r_sz(m_name);
	m_flags = uint8_t(r.r_u32() & UINT8_MAX);
	create_envelopes();
	for (uint_fast32_t i = 0; i != 6; ++i)
		m_envelopes[i]->load_1(r);
}